

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void Abc_ObjPrintNeighborhood_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes,int depth)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pObj2;
  int depth_local;
  Vec_Ptr_t *vNodes_local;
  Abc_Obj_t *pObj_local;
  
  if (((*(uint *)&pObj->field_0x14 >> 6 & 1) == 0) && (-1 < depth)) {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffbf | 0x40;
    Vec_PtrPush(vNodes,pObj);
    Abc_ObjPrint(_stdout,pObj);
    for (local_2c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar2 = Abc_ObjFanout(pObj,local_2c);
      Abc_ObjPrintNeighborhood_rec(pAVar2,vNodes,depth + -1);
    }
    for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar2 = Abc_ObjFanin(pObj,local_2c);
      Abc_ObjPrintNeighborhood_rec(pAVar2,vNodes,depth + -1);
    }
  }
  return;
}

Assistant:

static void Abc_ObjPrintNeighborhood_rec( Abc_Obj_t *pObj, Vec_Ptr_t *vNodes, int depth ) {
  Abc_Obj_t *pObj2;
  int i;
  
  if (pObj->fMarkC || depth < 0) return;

  pObj->fMarkC = 1;
  Vec_PtrPush( vNodes, pObj );

  Abc_ObjPrint( stdout, pObj );

  Abc_ObjForEachFanout(pObj, pObj2, i) {
    Abc_ObjPrintNeighborhood_rec( pObj2, vNodes, depth-1 );
  }
  Abc_ObjForEachFanin(pObj, pObj2, i) {
    Abc_ObjPrintNeighborhood_rec( pObj2, vNodes, depth-1 );
  }
}